

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O2

void __thiscall
BRTS<UFPC>::FindRuns(BRTS<UFPC> *this,uint64_t *bits_start,int height,int data_width,Run *runs)

{
  ulong *puVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  uint *puVar5;
  uint i;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  unsigned_short uVar10;
  uint64_t *puVar11;
  uint64_t *puVar12;
  short sVar13;
  uint64_t *puVar14;
  unsigned_short uVar15;
  long lVar16;
  ulong uVar17;
  uint64_t uVar18;
  Run *pRVar19;
  Run *pRVar20;
  Run *pRVar21;
  Run *pRVar22;
  
  puVar5 = UFPC::P_;
  lVar7 = (long)data_width;
  uVar18 = *bits_start;
  sVar13 = 0;
  puVar12 = bits_start;
  pRVar19 = runs;
  while( true ) {
    while (puVar14 = puVar12 + 1, uVar18 != 0) {
      lVar9 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
        }
      }
      pRVar19->start_pos = (short)lVar9 + sVar13;
      uVar17 = (~uVar18 >> ((byte)lVar9 & 0x3f)) << ((byte)lVar9 & 0x3f);
      while (uVar17 == 0) {
        sVar13 = sVar13 + 0x40;
        puVar1 = puVar12 + 1;
        puVar12 = puVar12 + 1;
        uVar17 = ~*puVar1;
      }
      lVar9 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
        }
      }
      pRVar19->end_pos = (short)lVar9 + sVar13;
      puVar5[UFPC::length_] = UFPC::length_;
      uVar6 = UFPC::length_ + 1;
      pRVar19->label = UFPC::length_;
      UFPC::length_ = uVar6;
      pRVar19 = pRVar19 + 1;
      uVar18 = (~uVar17 >> ((byte)lVar9 & 0x3f)) << ((byte)lVar9 & 0x3f);
    }
    if (puVar14 == bits_start + lVar7) break;
    sVar13 = sVar13 + 0x40;
    uVar18 = *puVar14;
    puVar12 = puVar14;
  }
  pRVar19->start_pos = 0xffff;
  pRVar19->end_pos = 0xffff;
  for (lVar9 = 1; lVar9 < height; lVar9 = lVar9 + 1) {
    pRVar20 = pRVar19 + 1;
    puVar12 = bits_start + lVar9 * lVar7;
    puVar14 = puVar12 + lVar7;
    uVar18 = *puVar12;
    lVar8 = 0;
    pRVar19 = pRVar20;
    while( true ) {
      while (puVar11 = puVar12 + 1, uVar18 != 0) {
        lVar3 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        uVar17 = (~uVar18 >> ((byte)lVar3 & 0x3f)) << ((byte)lVar3 & 0x3f);
        lVar16 = lVar8;
        while (uVar17 == 0) {
          lVar16 = lVar16 + 0x40;
          puVar1 = puVar12 + 1;
          puVar12 = puVar12 + 1;
          uVar17 = ~*puVar1;
        }
        lVar4 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        pRVar22 = runs + -1;
        do {
          pRVar21 = pRVar22;
          runs = runs + 1;
          uVar2 = pRVar21[1].end_pos;
          pRVar22 = pRVar21 + 1;
        } while ((uint)uVar2 < ((int)lVar3 + (int)lVar8 & 0xffffU));
        uVar15 = (short)lVar3 + (short)lVar8;
        uVar10 = (unsigned_short)(lVar4 + lVar16);
        uVar6 = (uint)(lVar4 + lVar16) & 0xffff;
        if (uVar6 < pRVar22->start_pos) {
          pRVar19->start_pos = uVar15;
          pRVar19->end_pos = uVar10;
          UFPC::P_[UFPC::length_] = UFPC::length_;
          i = UFPC::length_;
          UFPC::length_ = UFPC::length_ + 1;
        }
        else {
          i = UFPC::P_[pRVar21[1].label];
          for (; (uVar2 < uVar6 && (pRVar22 = runs, runs->start_pos <= uVar6)); runs = runs + 1) {
            if (i != UFPC::P_[runs->label]) {
              i = UFPC::Merge(i,UFPC::P_[runs->label]);
            }
            uVar2 = runs->end_pos;
          }
          pRVar19->start_pos = uVar15;
          pRVar19->end_pos = uVar10;
        }
        pRVar19->label = i;
        pRVar19 = pRVar19 + 1;
        lVar8 = lVar16;
        runs = pRVar22;
        uVar18 = -1L << ((byte)lVar4 & 0x3f) & ~uVar17;
      }
      if (puVar11 == puVar14) break;
      uVar18 = *puVar11;
      lVar8 = lVar8 + 0x40;
      puVar12 = puVar11;
    }
    pRVar19->start_pos = 0xffff;
    pRVar19->end_pos = 0xffff;
    runs = pRVar20;
  }
  uVar6 = UFPC::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
  return;
}

Assistant:

void FindRuns(const uint64_t* bits_start, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);

            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::NewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;
            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this run starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::NewLabel();
                    continue;
                };

                unsigned label = LabelsSolver::GetLabel(runs_up->label);

                //Next upper run can not meet this
                if (end_pos <= runs_up->end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = label;
                    continue;
                }

                //Find next upper runs meet this
                runs_up++;
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                    if (label != label_other) label = LabelsSolver::Merge(label, label_other);
                    if (end_pos <= runs_up->end_pos) break;
                }
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
                runs->label = label;
            }

        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::Flatten();
    }